

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3SegReaderNew
              (int iAge,int bLookup,sqlite3_int64 iStartLeaf,sqlite3_int64 iEndLeaf,
              sqlite3_int64 iEndBlock,char *zRoot,int nRoot,Fts3SegReader **ppReader)

{
  undefined8 *puVar1;
  Fts3SegReader *__s;
  Fts3SegReader *__dest;
  int iVar2;
  size_t __n;
  
  iVar2 = 0;
  if (iStartLeaf == 0) {
    if (iEndLeaf != 0) {
      return 0x10b;
    }
    iVar2 = nRoot + 0x14;
  }
  __s = (Fts3SegReader *)sqlite3_malloc(iVar2 + 0x88);
  if (__s == (Fts3SegReader *)0x0) {
    iVar2 = 7;
  }
  else {
    memset(__s,0,0x88);
    __s->iIdx = iAge;
    __s->bLookup = bLookup != 0;
    __s->iStartBlock = iStartLeaf;
    __s->iLeafEndBlock = iEndLeaf;
    __s->iEndBlock = iEndBlock;
    if (iVar2 == 0) {
      __s->iCurrentBlock = iStartLeaf + -1;
    }
    else {
      __dest = __s + 1;
      __s->aNode = (char *)__dest;
      __s->rootOnly = '\x01';
      __s->nNode = nRoot;
      if (nRoot == 0) {
        __n = 0;
      }
      else {
        __n = (size_t)nRoot;
        memcpy(__dest,zRoot,__n);
      }
      puVar1 = (undefined8 *)((long)&__dest->iIdx + __n);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)&__s[1].iLeafEndBlock + __n) = 0;
    }
    *ppReader = __s;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3SegReaderNew(
  int iAge,                       /* Segment "age". */
  int bLookup,                    /* True for a lookup only */
  sqlite3_int64 iStartLeaf,       /* First leaf to traverse */
  sqlite3_int64 iEndLeaf,         /* Final leaf to traverse */
  sqlite3_int64 iEndBlock,        /* Final block of segment */
  const char *zRoot,              /* Buffer containing root node */
  int nRoot,                      /* Size of buffer containing root node */
  Fts3SegReader **ppReader        /* OUT: Allocated Fts3SegReader */
){
  Fts3SegReader *pReader;         /* Newly allocated SegReader object */
  int nExtra = 0;                 /* Bytes to allocate segment root node */

  assert( zRoot!=0 || nRoot==0 );
#ifdef CORRUPT_DB
  assert( zRoot!=0 || CORRUPT_DB );
#endif

  if( iStartLeaf==0 ){
    if( iEndLeaf!=0 ) return FTS_CORRUPT_VTAB;
    nExtra = nRoot + FTS3_NODE_PADDING;
  }

  pReader = (Fts3SegReader *)sqlite3_malloc(sizeof(Fts3SegReader) + nExtra);
  if( !pReader ){
    return SQLITE_NOMEM;
  }
  memset(pReader, 0, sizeof(Fts3SegReader));
  pReader->iIdx = iAge;
  pReader->bLookup = bLookup!=0;
  pReader->iStartBlock = iStartLeaf;
  pReader->iLeafEndBlock = iEndLeaf;
  pReader->iEndBlock = iEndBlock;

  if( nExtra ){
    /* The entire segment is stored in the root node. */
    pReader->aNode = (char *)&pReader[1];
    pReader->rootOnly = 1;
    pReader->nNode = nRoot;
    if( nRoot ) memcpy(pReader->aNode, zRoot, nRoot);
    memset(&pReader->aNode[nRoot], 0, FTS3_NODE_PADDING);
  }else{
    pReader->iCurrentBlock = iStartLeaf-1;
  }
  *ppReader = pReader;
  return SQLITE_OK;
}